

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.cc
# Opt level: O1

void brotli::BuildMetaBlockGreedy
               (uint8_t *ringbuffer,size_t pos,size_t mask,Command *commands,size_t n_commands,
               MetaBlockSplit *mb)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  Command *pCVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  BlockSplitter<brotli::Histogram<520>_> dist_blocks;
  BlockSplitter<brotli::Histogram<704>_> cmd_blocks;
  BlockSplitter<brotli::Histogram<256>_> lit_blocks;
  BlockSplitter<brotli::Histogram<520>_> local_180;
  BlockSplitter<brotli::Histogram<704>_> local_110;
  BlockSplitter<brotli::Histogram<256>_> local_a0;
  
  if (n_commands == 0) {
    sVar6 = 0;
  }
  else {
    sVar6 = 0;
    pCVar5 = commands;
    sVar7 = n_commands;
    do {
      sVar6 = sVar6 + pCVar5->insert_len_;
      pCVar5 = pCVar5 + 1;
      sVar7 = sVar7 - 1;
    } while (sVar7 != 0);
  }
  BlockSplitter<brotli::Histogram<256>_>::BlockSplitter
            (&local_a0,0x100,0x200,400.0,sVar6,&mb->literal_split,&mb->literal_histograms);
  BlockSplitter<brotli::Histogram<704>_>::BlockSplitter
            (&local_110,0x2c0,0x400,500.0,n_commands,&mb->command_split,&mb->command_histograms);
  BlockSplitter<brotli::Histogram<520>_>::BlockSplitter
            (&local_180,0x40,0x200,100.0,n_commands,&mb->distance_split,&mb->distance_histograms);
  if (n_commands != 0) {
    sVar6 = 0;
    do {
      uVar3 = commands[sVar6].insert_len_;
      uVar4 = commands[sVar6].copy_len_;
      uVar1 = commands[sVar6].cmd_prefix_;
      uVar2 = commands[sVar6].dist_prefix_;
      BlockSplitter<brotli::Histogram<704>_>::AddSymbol(&local_110,(ulong)uVar1);
      for (uVar8 = (ulong)uVar3; uVar8 != 0; uVar8 = uVar8 - 1) {
        BlockSplitter<brotli::Histogram<256>_>::AddSymbol(&local_a0,(ulong)ringbuffer[pos & mask]);
        pos = pos + 1;
      }
      if ((ulong)uVar4 != 0 && 0x7f < uVar1) {
        BlockSplitter<brotli::Histogram<520>_>::AddSymbol(&local_180,(ulong)uVar2);
      }
      pos = pos + uVar4;
      sVar6 = sVar6 + 1;
    } while (sVar6 != n_commands);
  }
  BlockSplitter<brotli::Histogram<256>_>::FinishBlock(&local_a0,true);
  BlockSplitter<brotli::Histogram<704>_>::FinishBlock(&local_110,true);
  BlockSplitter<brotli::Histogram<520>_>::FinishBlock(&local_180,true);
  return;
}

Assistant:

void BuildMetaBlockGreedy(const uint8_t* ringbuffer,
                          size_t pos,
                          size_t mask,
                          const Command *commands,
                          size_t n_commands,
                          MetaBlockSplit* mb) {
  size_t num_literals = 0;
  for (size_t i = 0; i < n_commands; ++i) {
    num_literals += commands[i].insert_len_;
  }

  BlockSplitter<HistogramLiteral> lit_blocks(
      256, 512, 400.0, num_literals,
      &mb->literal_split, &mb->literal_histograms);
  BlockSplitter<HistogramCommand> cmd_blocks(
      kNumCommandPrefixes, 1024, 500.0, n_commands,
      &mb->command_split, &mb->command_histograms);
  BlockSplitter<HistogramDistance> dist_blocks(
      64, 512, 100.0, n_commands,
      &mb->distance_split, &mb->distance_histograms);

  for (size_t i = 0; i < n_commands; ++i) {
    const Command cmd = commands[i];
    cmd_blocks.AddSymbol(cmd.cmd_prefix_);
    for (size_t j = cmd.insert_len_; j != 0; --j) {
      lit_blocks.AddSymbol(ringbuffer[pos & mask]);
      ++pos;
    }
    pos += cmd.copy_len_;
    if (cmd.copy_len_ > 0 && cmd.cmd_prefix_ >= 128) {
      dist_blocks.AddSymbol(cmd.dist_prefix_);
    }
  }

  lit_blocks.FinishBlock(/* is_final = */ true);
  cmd_blocks.FinishBlock(/* is_final = */ true);
  dist_blocks.FinishBlock(/* is_final = */ true);
}